

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef text;
  StringRef text_00;
  StringRef ref;
  StringRef ref_00;
  int iVar1;
  ulong uVar2;
  TestCaseStats *in_RSI;
  StreamingReporterBase *in_RDI;
  StringRef SVar3;
  ScopedElement e;
  string *in_stack_fffffffffffffe48;
  StringRef *in_stack_fffffffffffffe50;
  double *in_stack_fffffffffffffe58;
  ScopedElement *in_stack_fffffffffffffe60;
  ScopedElement *this_00;
  undefined4 in_stack_fffffffffffffe68;
  XmlFormatting in_stack_fffffffffffffe6c;
  allocator<char> *paVar4;
  string *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  XmlFormatting in_stack_fffffffffffffe7c;
  XmlWriter *in_stack_fffffffffffffe80;
  allocator<char> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  allocator<char> local_121;
  string local_120 [64];
  StringRef local_e0;
  allocator<char> local_c9;
  string local_c8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  StringRef local_90;
  StringRef local_80;
  undefined1 local_69;
  StringRef local_68;
  allocator<char> local_41;
  string local_40 [48];
  TestCaseStats *local_10;
  
  local_10 = in_RSI;
  StreamingReporterBase::testCaseEnded(in_RDI,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
             (allocator<char> *)in_stack_fffffffffffffe80);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_68 = operator____sr((char *)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
  local_69 = Counts::allOk(&(local_10->totals).assertions);
  name.m_start._4_4_ = in_stack_fffffffffffffe6c;
  name.m_start._0_4_ = in_stack_fffffffffffffe68;
  name.m_size = (size_type)in_stack_fffffffffffffe70;
  XmlWriter::ScopedElement::writeAttribute<bool,void>
            (in_stack_fffffffffffffe60,name,(bool *)in_stack_fffffffffffffe58);
  local_80 = operator____sr((char *)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
  name_00.m_start._4_4_ = in_stack_fffffffffffffe6c;
  name_00.m_start._0_4_ = in_stack_fffffffffffffe68;
  name_00.m_size = (size_type)in_stack_fffffffffffffe70;
  XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
            (in_stack_fffffffffffffe60,name_00,(unsigned_long *)in_stack_fffffffffffffe58);
  iVar1 = (*((in_RDI->super_ReporterBase).super_IEventListener.m_config)->_vptr_IConfig[0xb])();
  if (iVar1 == 1) {
    local_90 = operator____sr((char *)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe90 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Timer::getElapsedSeconds((Timer *)0x1af818);
    name_01.m_start._4_4_ = in_stack_fffffffffffffe6c;
    name_01.m_start._0_4_ = in_stack_fffffffffffffe68;
    name_01.m_size = (size_type)in_stack_fffffffffffffe70;
    local_98 = in_stack_fffffffffffffe90;
    XmlWriter::ScopedElement::writeAttribute<double,void>
              (in_stack_fffffffffffffe60,name_01,in_stack_fffffffffffffe58);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    in_stack_fffffffffffffe80 =
         (XmlWriter *)&in_RDI[1].super_ReporterBase.super_IEventListener.m_preferences;
    in_stack_fffffffffffffe88 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
               (allocator<char> *)in_stack_fffffffffffffe80);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              ((XmlWriter *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    StringRef::StringRef(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    ref.m_start._4_4_ = in_stack_fffffffffffffe7c;
    ref.m_start._0_4_ = in_stack_fffffffffffffe78;
    ref.m_size = (size_type)in_stack_fffffffffffffe80;
    local_e0 = trim(ref);
    in_stack_fffffffffffffe70 = (string *)local_e0.m_size;
    in_stack_fffffffffffffe78 = local_e0.m_start._0_4_;
    in_stack_fffffffffffffe7c = local_e0.m_start._4_4_;
    text.m_start._4_4_ = in_stack_fffffffffffffe6c;
    text.m_start._0_4_ = in_stack_fffffffffffffe68;
    text.m_size = (size_type)in_stack_fffffffffffffe70;
    XmlWriter::ScopedElement::writeText
              (in_stack_fffffffffffffe60,text,
               (XmlFormatting)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  uVar2 = std::__cxx11::string::empty();
  SVar3.m_size = (size_type)in_stack_fffffffffffffe50;
  SVar3.m_start = (char *)in_stack_fffffffffffffe58;
  if ((uVar2 & 1) == 0) {
    this_00 = (ScopedElement *)&in_RDI[1].super_ReporterBase.super_IEventListener.m_preferences;
    paVar4 = &local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
               (allocator<char> *)in_stack_fffffffffffffe80);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              ((XmlWriter *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe70,(XmlFormatting)((ulong)paVar4 >> 0x20));
    StringRef::StringRef(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    ref_00.m_start._4_4_ = in_stack_fffffffffffffe7c;
    ref_00.m_start._0_4_ = in_stack_fffffffffffffe78;
    ref_00.m_size = (size_type)in_stack_fffffffffffffe80;
    SVar3 = trim(ref_00);
    text_00.m_size = (size_type)in_stack_fffffffffffffe70;
    text_00.m_start = (char *)paVar4;
    XmlWriter::ScopedElement::writeText(this_00,text_00,SVar3.m_start._4_4_);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)SVar3.m_size);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
  }
  operator|(Newline,Indent);
  XmlWriter::endElement(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)SVar3.m_size);
  return;
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success"_sr, testCaseStats.totals.assertions.allOk() );
        e.writeAttribute( "skips"_sr, testCaseStats.totals.assertions.skipped );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds"_sr, m_testCaseTimer.getElapsedSeconds() );
        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( StringRef(testCaseStats.stdOut) ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( StringRef(testCaseStats.stdErr) ), XmlFormatting::Newline );

        m_xml.endElement();
    }